

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall mjs::lexer::next_token(lexer *this)

{
  wchar_t wVar1;
  wchar_t ch;
  version vVar2;
  wchar_t *pwVar3;
  byte bVar4;
  bool bVar5;
  classification cVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  void *pvVar10;
  int *piVar11;
  ostream *poVar12;
  runtime_error *prVar13;
  uint uVar14;
  token_type type;
  anon_unknown_2 *this_00;
  byte bVar16;
  version in_R9D;
  anon_unknown_2 *paVar17;
  char *pcVar18;
  anon_unknown_2 *paVar19;
  long lVar20;
  long lVar21;
  wstring_view text;
  wstring_view text_00;
  wstring_view text_01;
  char *end;
  wchar_t *local_220;
  wchar_t *local_218;
  anon_unknown_2 *local_210;
  double local_208;
  wstring s;
  wstring qs;
  ostringstream oss;
  wchar_t *pwVar15;
  
  this_00 = (anon_unknown_2 *)(this->text_)._M_len;
  paVar17 = (anon_unknown_2 *)this->text_pos_;
  if (this_00 == paVar17) {
    token::operator=(&this->current_token_,(token *)eof_token);
    return;
  }
  if (this_00 <= paVar17) {
    __assert_fail("text_pos_ < text_.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                  0x22a,"void mjs::lexer::next_token()");
  }
  pwVar3 = (this->text_)._M_str;
  pwVar15 = pwVar3 + (long)paVar17;
  wVar1 = *pwVar15;
  paVar19 = paVar17 + 1;
  local_218 = pwVar3;
  local_210 = paVar19;
  if ((wVar1 == L'\'') || (wVar1 == L'\"')) {
    local_208 = (double)CONCAT44(local_208._4_4_,this->version_);
    s._M_string_length = 0;
    s._M_dataplus._M_p = (pointer)&s.field_2;
    s.field_2._M_local_buf[0] = L'\0';
    wVar1 = *pwVar15;
    if ((wVar1 != L'\"') && (wVar1 != L'\'')) {
      __assert_fail("ch == \'\"\' || ch == \'\\\'\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp"
                    ,0xd9,
                    "std::pair<token, size_t> mjs::(anonymous namespace)::get_string_literal(const std::wstring_view, const size_t, version)"
                   );
    }
    bVar5 = false;
LAB_0015a59e:
    while( true ) {
      while( true ) {
        paVar19 = paVar17 + 1;
        if (this_00 <= paVar19) {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar13,"Unterminated string");
          __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        ch = local_218[(long)(paVar17 + 1)];
        vVar2 = local_208._0_4_;
        if (bVar5) break;
        bVar5 = true;
        paVar17 = paVar19;
        if (ch != L'\\') {
          if (ch != wVar1) {
            bVar5 = anon_unknown_2::is_line_terminator(ch,local_208._0_4_);
            if (bVar5) {
              prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar13,"Line terminator in string");
            }
            else {
              if ((vVar2 != es3) || (cVar6 = anon_unknown_2::classify(ch), cVar6 != format))
              goto LAB_0015a789;
              prVar13 = (runtime_error *)__cxa_allocate_exception(0x10,ch);
              std::runtime_error::runtime_error
                        (prVar13,"Format control characters not allowed in string literals in ES3");
            }
            goto LAB_0015b88d;
          }
          token::token((token *)&qs,string_literal,&s);
          token::token((token *)&oss,(token *)&qs);
          token::~token((token *)&qs);
          std::__cxx11::wstring::~wstring((wstring *)&s);
          goto LAB_0015a7f9;
        }
      }
      if (7 < (uint)(ch + L'\xffffffd0')) break;
      lVar20 = (ulong)((uint)(ch + L'\xffffffd0') < 4) + 2;
      for (lVar9 = 1;
          (lVar21 = lVar20, lVar20 != lVar9 && (lVar21 = lVar9, paVar17 + lVar9 + 1 < this_00));
          lVar9 = lVar9 + 1) {
        uVar14 = pwVar3[(long)(paVar17 + lVar9 + 1)] + L'\xffffffd0';
        if (9 < uVar14) {
          uVar14 = 0xffffffff;
        }
        if (7 < uVar14) break;
      }
      bVar5 = false;
      std::__cxx11::wstring::push_back((wchar_t)&s);
      paVar17 = paVar17 + lVar21;
    }
    switch(ch) {
    case L'n':
      break;
    case L'o':
    case L'p':
    case L'q':
    case L's':
    case L'w':
switchD_0015a6e2_caseD_6f:
      bVar5 = anon_unknown_2::is_line_terminator(ch,local_208._0_4_);
      if (!bVar5) {
LAB_0015b7b5:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar12 = std::operator<<((ostream *)&oss,"Unhandled escape sequence: \\");
        std::operator<<(poVar12,(char)ch);
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar13,(string *)&qs);
        __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar5 = false;
      paVar17 = paVar19;
      if ((int)local_208._0_4_ < 2) {
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar13,"Line continuations in string literals not supported until ES5");
LAB_0015b88d:
        __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0015a59e;
    case L'r':
      break;
    case L't':
      break;
    case L'u':
switchD_0015a6e2_caseD_75:
      if (paVar17 + 6 < this_00) {
        get_hex_value4(pwVar3 + (long)(paVar17 + 2));
        std::__cxx11::wstring::push_back((wchar_t)&s);
        paVar17 = paVar17 + 5;
        goto LAB_0015a763;
      }
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar13,"Invalid unicode escape sequence");
      goto LAB_0015b88d;
    case L'v':
      if (local_208._0_4_ == es1) goto LAB_0015b7b5;
      break;
    case L'x':
switchD_0015a6e2_caseD_78:
      if (this_00 <= paVar17 + 4) {
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar13,"Invalid hex escape sequence");
        goto LAB_0015b88d;
      }
      get_hex_value2(pwVar3 + (long)(paVar17 + 2));
      std::__cxx11::wstring::push_back((wchar_t)&s);
      paVar17 = paVar17 + 3;
LAB_0015a763:
      bVar5 = false;
      goto LAB_0015a59e;
    default:
      if ((ch != L'\"') && (ch != L'\'')) {
        if (ch == L'U') goto switchD_0015a6e2_caseD_75;
        if (ch == L'X') goto switchD_0015a6e2_caseD_78;
        if (((ch != L'f') && (ch != L'b')) && (ch != L'\\')) goto switchD_0015a6e2_caseD_6f;
      }
    }
LAB_0015a789:
    bVar5 = false;
    std::__cxx11::wstring::push_back((wchar_t)&s);
    paVar17 = paVar19;
    goto LAB_0015a59e;
  }
  vVar2 = this->version_;
  bVar5 = anon_unknown_2::is_line_terminator(wVar1,vVar2);
  if (bVar5) {
    while ((paVar17 = this_00, paVar19 < this_00 &&
           (bVar5 = anon_unknown_2::is_line_terminator(local_218[(long)paVar19],vVar2),
           paVar17 = paVar19, bVar5))) {
      paVar19 = paVar19 + 1;
    }
    _oss = line_terminator;
    local_210 = paVar17;
LAB_0015a9e2:
    token::operator=(&this->current_token_,(token *)&oss);
    goto LAB_0015a801;
  }
  if (((uint)(wVar1 + L'\xffffffd0') < 10) ||
     ((paVar19 < this_00 && wVar1 == L'.' &&
      ((uint)(local_218[(long)(paVar17 + 1)] + L'\xffffffd0') < 10)))) {
    if (*pwVar15 == L'0') {
      if (paVar19 < this_00) {
        if (local_218[(long)(paVar17 + 1)] == L'.') goto LAB_0015a898;
        iVar8 = tolower(local_218[(long)(paVar17 + 1)]);
        if (iVar8 != 0x78) goto LAB_0015b47f;
        qs._M_string_length = 0;
        for (paVar17 = paVar17 + 2; paVar17 < this_00; paVar17 = paVar17 + 1) {
          wVar1 = local_218[(long)paVar17];
          local_208 = (double)qs._M_string_length;
          if (9 < (uint)(wVar1 + L'\xffffffd0')) {
            iVar8 = isalpha(wVar1);
            qs._M_string_length = (size_type)local_208;
            if (iVar8 == 0) break;
          }
          uVar14 = get_hex_value(wVar1);
          qs._M_string_length = (size_type)(local_208 * 16.0 + (double)uVar14);
        }
      }
      else {
LAB_0015b47f:
        qs._M_string_length = 0;
        for (; (paVar19 < this_00 &&
               (wVar1 = local_218[(long)paVar19], (uint)(wVar1 + L'\xffffffd0') < 10));
            paVar19 = paVar19 + 1) {
          if (0x37 < (uint)wVar1) {
            prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
            qs._M_dataplus._M_p = (pointer)&qs.field_2;
            std::__cxx11::string::_M_construct((ulong)&qs,'\x01');
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss
                           ,"Invalid octal digit: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&qs)
            ;
            std::runtime_error::runtime_error(prVar13,(string *)&oss);
            __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          qs._M_string_length =
               (size_type)((double)qs._M_string_length * 8.0 + (double)wVar1 + -48.0);
        }
      }
      qs._M_dataplus._M_p._0_4_ = 3;
LAB_0015b4df:
      token::token((token *)&oss,(token *)&qs);
      goto LAB_0015b4f6;
    }
LAB_0015a898:
    bVar5 = *pwVar15 == L'.';
    bVar7 = false;
    bVar16 = 0;
    bVar4 = 0;
    for (; paVar17 = this_00, paVar19 < this_00; paVar19 = paVar19 + 1) {
      wVar1 = local_218[(long)paVar19];
      if ((uint)(wVar1 + L'\xffffffd0') < 10) {
LAB_0015a8bf:
        bVar16 = 0;
      }
      else {
        if (wVar1 == L'.') {
          if (bVar5) goto LAB_0015a8ef;
          bVar5 = true;
          goto LAB_0015a8bf;
        }
        if ((wVar1 & 0xffffffdfU) != 0x45 || bVar7) {
LAB_0015a8ef:
          paVar17 = paVar19;
          if ((bool)(bVar4 | ~bVar16 & 1)) break;
          bVar4 = 1;
          bVar16 = 0;
          if ((wVar1 != L'-') && (wVar1 != L'+')) break;
        }
        else {
          bVar7 = true;
          bVar16 = 1;
        }
      }
    }
    s._M_dataplus._M_p = (pointer)&s.field_2;
    std::__cxx11::string::_M_construct<wchar_t_const*>
              ((string *)&s,pwVar15,local_218 + (long)paVar17);
    piVar11 = __errno_location();
    *piVar11 = 0;
    qs._M_string_length = (size_type)strtod((char *)s._M_dataplus._M_p,&end);
    if (end != (char *)((long)s._M_dataplus._M_p + s._M_string_length)) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                     "Invalid string literal ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s);
      std::runtime_error::runtime_error(prVar13,(string *)&oss);
      __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (*piVar11 == 0x22) {
      *piVar11 = 0;
    }
    qs._M_dataplus._M_p._0_4_ = 3;
    token::token((token *)&oss,(token *)&qs);
    token::~token((token *)&qs);
    std::__cxx11::string::~string((string *)&s);
  }
  else {
    pvVar10 = memchr("!%&()*+,-./:;<=>?[]^{|}~",wVar1,0x19);
    if (pvVar10 == (void *)0x0) {
      if ((((uint)wVar1 < 0x21) && ((0x100001a00U >> ((ulong)(uint)wVar1 & 0x3f) & 1) != 0)) ||
         (wVar1 == L'\xfeff' && 1 < (int)vVar2)) {
        text._M_str = (wchar_t *)paVar17;
        text._M_len = (size_t)local_218;
        anon_unknown_2::skip_whitespace
                  ((pair<mjs::token,_unsigned_long> *)&oss,this_00,text,(ulong)vVar2,in_R9D);
      }
      else {
        bVar5 = anon_unknown_2::is_identifier_start_v1(wVar1);
        pwVar15 = local_218;
        if ((!bVar5) && (wVar1 != L'\\' || (int)vVar2 < 1)) {
          if ((int)vVar2 < 1) {
LAB_0015bb5b:
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
            poVar12 = std::operator<<((ostream *)&oss,"Unhandled character in ");
            poVar12 = std::operator<<(poVar12,"next_token");
            poVar12 = std::operator<<(poVar12,": ");
            poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,wVar1);
            poVar12 = std::operator<<(poVar12," 0x");
            *(uint *)(poVar12 + *(long *)(*(long *)poVar12 + -0x18) + 0x18) =
                 *(uint *)(poVar12 + *(long *)(*(long *)poVar12 + -0x18) + 0x18) & 0xffffffb5 | 8;
            poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,wVar1);
            std::operator<<(poVar12,"\n");
            prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar13,(string *)&qs);
            __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          cVar6 = anon_unknown_2::classify(wVar1);
          if (cVar6 != id_start) {
            if (cVar6 != whitespace) goto LAB_0015bb5b;
            text_01._M_str = (wchar_t *)this->text_pos_;
            text_01._M_len = (size_t)(this->text_)._M_str;
            anon_unknown_2::skip_whitespace
                      ((pair<mjs::token,_unsigned_long> *)&oss,
                       (anon_unknown_2 *)(this->text_)._M_len,text_01,(ulong)this->version_,in_R9D);
            goto LAB_0015a7f9;
          }
          this_00 = (anon_unknown_2 *)(this->text_)._M_len;
          paVar17 = (anon_unknown_2 *)this->text_pos_;
          vVar2 = this->version_;
          pwVar15 = (this->text_)._M_str;
        }
        text_00._M_str = (wchar_t *)paVar17;
        text_00._M_len = (size_t)pwVar15;
        anon_unknown_2::get_identifier
                  ((pair<mjs::token,_unsigned_long> *)&oss,this_00,text_00,(ulong)vVar2,in_R9D);
      }
    }
    else {
      if ((wVar1 != L'/' || this_00 <= paVar19) ||
         ((wVar1 = local_218[(long)(paVar17 + 1)], wVar1 != L'/' && (wVar1 != L'*')))) {
        end = (char *)(this_00 + -(long)paVar17);
        local_220 = pwVar15;
        if ((anon_unknown_2 *)end == (anon_unknown_2 *)0x0) {
          __assert_fail("!s.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp"
                        ,0x7c,
                        "std::tuple<token_type, int> mjs::(anonymous namespace)::get_punctuation(std::wstring_view, version)"
                       );
        }
        if ((int)vVar2 < 0) goto LAB_0015ba0c;
        if ((end < (anon_unknown_2 *)0x4) ||
           (iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&end,0,4,
                               L">>>="), iVar8 != 0)) {
          if ((char *)0x2 < end) {
            pcVar18 = (char *)0x3;
            iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&end,0,3,
                               L">>>");
            if (iVar8 == 0) {
              type = rshiftshift;
              goto LAB_0015b721;
            }
            if ((char *)0x2 < end) {
              pcVar18 = (char *)0x3;
              iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                                ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&end,0,3,
                                 L"<<=");
              if (iVar8 == 0) {
                type = lshiftequal;
                goto LAB_0015b721;
              }
              if ((char *)0x2 < end) {
                pcVar18 = (char *)0x3;
                iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                                  ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&end,0,
                                   3,L">>=");
                if (iVar8 == 0) {
                  type = rshiftequal;
                  goto LAB_0015b721;
                }
                if ((char *)0x2 < end && vVar2 != es1) {
                  pcVar18 = (char *)0x3;
                  iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&end,
                                     0,3,L"===");
                  if (iVar8 == 0) {
                    type = equalequalequal;
                    goto LAB_0015b721;
                  }
                  if ((char *)0x2 < end) {
                    pcVar18 = (char *)0x3;
                    iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                                      ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                                       &end,0,3,L"!==");
                    if (iVar8 == 0) {
                      type = notequalequal;
                      goto LAB_0015b721;
                    }
                  }
                }
              }
            }
          }
          if ((char *)0x1 < end) {
            pcVar18 = (char *)0x2;
            iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&end,0,2,
                               L"==");
            if (iVar8 == 0) {
              type = equalequal;
              goto LAB_0015b721;
            }
            if ((char *)0x1 < end) {
              pcVar18 = (char *)0x2;
              iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                                ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&end,0,2,
                                 L"!=");
              if (iVar8 == 0) {
                type = notequal;
                goto LAB_0015b721;
              }
              if ((char *)0x1 < end) {
                pcVar18 = (char *)0x2;
                iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                                  ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&end,0,
                                   2,L"<=");
                if (iVar8 == 0) {
                  type = ltequal;
                  goto LAB_0015b721;
                }
                if ((char *)0x1 < end) {
                  pcVar18 = (char *)0x2;
                  iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&end,
                                     0,2,L">=");
                  if (iVar8 == 0) {
                    type = gtequal;
                    goto LAB_0015b721;
                  }
                  if ((char *)0x1 < end) {
                    pcVar18 = (char *)0x2;
                    iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                                      ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                                       &end,0,2,L"&&");
                    if (iVar8 == 0) {
                      type = andand;
                      goto LAB_0015b721;
                    }
                    if ((char *)0x1 < end) {
                      pcVar18 = (char *)0x2;
                      iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                                         &end,0,2,L"||");
                      if (iVar8 == 0) {
                        type = oror;
                        goto LAB_0015b721;
                      }
                      if ((char *)0x1 < end) {
                        pcVar18 = (char *)0x2;
                        iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                                          ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *
                                           )&end,0,2,L"++");
                        if (iVar8 == 0) {
                          type = plusplus;
                          goto LAB_0015b721;
                        }
                        if ((char *)0x1 < end) {
                          pcVar18 = (char *)0x2;
                          iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::
                                  compare((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                                          &end,0,2,L"--");
                          if (iVar8 == 0) {
                            type = minusminus;
                            goto LAB_0015b721;
                          }
                          if ((char *)0x1 < end) {
                            pcVar18 = (char *)0x2;
                            iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::
                                    compare((basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                             *)&end,0,2,L"<<");
                            if (iVar8 == 0) {
                              type = lshift;
                              goto LAB_0015b721;
                            }
                            if ((char *)0x1 < end) {
                              pcVar18 = (char *)0x2;
                              iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::
                                      compare((basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                               *)&end,0,2,L">>");
                              if (iVar8 == 0) {
                                type = rshift;
                                goto LAB_0015b721;
                              }
                              if ((char *)0x1 < end) {
                                pcVar18 = (char *)0x2;
                                iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                        ::compare((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,2,L"+=");
                                if (iVar8 == 0) {
                                  type = plusequal;
                                  goto LAB_0015b721;
                                }
                                if ((char *)0x1 < end) {
                                  pcVar18 = (char *)0x2;
                                  iVar8 = std::
                                          basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::
                                          compare((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,2,L"-=");
                                  if (iVar8 == 0) {
                                    type = minusequal;
                                    goto LAB_0015b721;
                                  }
                                  if ((char *)0x1 < end) {
                                    pcVar18 = (char *)0x2;
                                    iVar8 = std::
                                            basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::
                                            compare((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,2,L"*=");
                                    if (iVar8 == 0) {
                                      type = multiplyequal;
                                      goto LAB_0015b721;
                                    }
                                    if ((char *)0x1 < end) {
                                      pcVar18 = (char *)0x2;
                                      iVar8 = std::
                                              basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                              ::compare((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,2,L"/=");
                                      if (iVar8 == 0) {
                                        type = divideequal;
                                        goto LAB_0015b721;
                                      }
                                      if ((char *)0x1 < end) {
                                        pcVar18 = (char *)0x2;
                                        iVar8 = std::
                                                basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                ::compare((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,2,L"&=");
                                        if (iVar8 == 0) {
                                          type = andequal;
                                          goto LAB_0015b721;
                                        }
                                        if ((char *)0x1 < end) {
                                          pcVar18 = (char *)0x2;
                                          iVar8 = std::
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  ::compare((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,2,L"|=");
                                          if (iVar8 == 0) {
                                            type = orequal;
                                            goto LAB_0015b721;
                                          }
                                          if ((char *)0x1 < end) {
                                            pcVar18 = (char *)0x2;
                                            iVar8 = std::
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  ::compare((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,2,L"^=");
                                            if (iVar8 == 0) {
                                              type = xorequal;
                                              goto LAB_0015b721;
                                            }
                                            if ((char *)0x1 < end) {
                                              pcVar18 = (char *)0x2;
                                              iVar8 = std::
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  ::compare((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,2,L"%=");
                                              if (iVar8 == 0) {
                                                type = modequal;
                                                goto LAB_0015b721;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          if (end == (char *)0x0) goto LAB_0015ba0c;
          pcVar18 = (char *)0x1;
          iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&end,0,1,L"="
                            );
          if (iVar8 == 0) {
            type = equal;
          }
          else {
            if (end == (char *)0x0) goto LAB_0015ba0c;
            pcVar18 = (char *)0x1;
            iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&end,0,1,
                               L">");
            if (iVar8 == 0) {
              type = gt;
            }
            else {
              if (end == (char *)0x0) goto LAB_0015ba0c;
              pcVar18 = (char *)0x1;
              iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                                ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&end,0,1,
                                 L"<");
              if (iVar8 == 0) {
                type = lt;
              }
              else {
                if (end == (char *)0x0) goto LAB_0015ba0c;
                pcVar18 = (char *)0x1;
                iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                                  ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&end,0,
                                   1,L",");
                if (iVar8 == 0) {
                  type = comma;
                }
                else {
                  if (end == (char *)0x0) goto LAB_0015ba0c;
                  pcVar18 = (char *)0x1;
                  iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&end,
                                     0,1,L"!");
                  if (iVar8 == 0) {
                    type = not_;
                  }
                  else {
                    if (end == (char *)0x0) goto LAB_0015ba0c;
                    pcVar18 = (char *)0x1;
                    iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                                      ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                                       &end,0,1,L"~");
                    if (iVar8 == 0) {
                      type = tilde;
                    }
                    else {
                      if (end == (char *)0x0) goto LAB_0015ba0c;
                      pcVar18 = (char *)0x1;
                      iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                                         &end,0,1,L"?");
                      if (iVar8 == 0) {
                        type = question;
                      }
                      else {
                        if (end == (char *)0x0) goto LAB_0015ba0c;
                        pcVar18 = (char *)0x1;
                        iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                                          ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *
                                           )&end,0,1,L":");
                        if (iVar8 == 0) {
                          type = colon;
                        }
                        else {
                          if (end == (char *)0x0) goto LAB_0015ba0c;
                          pcVar18 = (char *)0x1;
                          iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::
                                  compare((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                                          &end,0,1,L".");
                          if (iVar8 == 0) {
                            type = dot;
                          }
                          else {
                            if (end == (char *)0x0) goto LAB_0015ba0c;
                            pcVar18 = (char *)0x1;
                            iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::
                                    compare((basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                             *)&end,0,1,L"+");
                            if (iVar8 == 0) {
                              type = plus;
                            }
                            else {
                              if (end == (char *)0x0) goto LAB_0015ba0c;
                              pcVar18 = (char *)0x1;
                              iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::
                                      compare((basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                               *)&end,0,1,L"-");
                              if (iVar8 == 0) {
                                type = minus;
                              }
                              else {
                                if (end == (char *)0x0) goto LAB_0015ba0c;
                                pcVar18 = (char *)0x1;
                                iVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                        ::compare((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,1,L"*");
                                if (iVar8 == 0) {
                                  type = multiply;
                                }
                                else {
                                  if (end == (char *)0x0) goto LAB_0015ba0c;
                                  pcVar18 = (char *)0x1;
                                  iVar8 = std::
                                          basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::
                                          compare((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,1,L"/");
                                  if (iVar8 == 0) {
                                    type = divide;
                                  }
                                  else {
                                    if (end == (char *)0x0) goto LAB_0015ba0c;
                                    pcVar18 = (char *)0x1;
                                    iVar8 = std::
                                            basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::
                                            compare((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,1,L"&");
                                    if (iVar8 == 0) {
                                      type = and_;
                                    }
                                    else {
                                      if (end == (char *)0x0) goto LAB_0015ba0c;
                                      pcVar18 = (char *)0x1;
                                      iVar8 = std::
                                              basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                              ::compare((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,1,L"|");
                                      if (iVar8 == 0) {
                                        type = or_;
                                      }
                                      else {
                                        if (end == (char *)0x0) goto LAB_0015ba0c;
                                        pcVar18 = (char *)0x1;
                                        iVar8 = std::
                                                basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                ::compare((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,1,L"^");
                                        if (iVar8 == 0) {
                                          type = xor_;
                                        }
                                        else {
                                          if (end == (char *)0x0) goto LAB_0015ba0c;
                                          pcVar18 = (char *)0x1;
                                          iVar8 = std::
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  ::compare((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,1,L"%");
                                          if (iVar8 == 0) {
                                            type = mod;
                                          }
                                          else {
                                            if (end == (char *)0x0) goto LAB_0015ba0c;
                                            pcVar18 = (char *)0x1;
                                            iVar8 = std::
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  ::compare((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,1,L"(");
                                            if (iVar8 == 0) {
                                              type = lparen;
                                            }
                                            else {
                                              if (end == (char *)0x0) goto LAB_0015ba0c;
                                              pcVar18 = (char *)0x1;
                                              iVar8 = std::
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  ::compare((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,1,L")");
                                              if (iVar8 == 0) {
                                                type = rparen;
                                              }
                                              else {
                                                if (end == (char *)0x0) goto LAB_0015ba0c;
                                                pcVar18 = (char *)0x1;
                                                iVar8 = std::
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  ::compare((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,1,L"{");
                                                if (iVar8 == 0) {
                                                  type = lbrace;
                                                }
                                                else {
                                                  if (end == (char *)0x0) goto LAB_0015ba0c;
                                                  pcVar18 = (char *)0x1;
                                                  iVar8 = std::
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  ::compare((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,1,L"}");
                                                  if (iVar8 == 0) {
                                                    type = rbrace;
                                                  }
                                                  else {
                                                    if (end == (char *)0x0) goto LAB_0015ba0c;
                                                    pcVar18 = (char *)0x1;
                                                    iVar8 = std::
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  ::compare((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,1,L"[");
                                                  if (iVar8 == 0) {
                                                    type = lbracket;
                                                  }
                                                  else {
                                                    if (end == (char *)0x0) goto LAB_0015ba0c;
                                                    pcVar18 = (char *)0x1;
                                                    iVar8 = std::
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  ::compare((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,1,L"]");
                                                  if (iVar8 == 0) {
                                                    type = rbracket;
                                                  }
                                                  else {
                                                    if (end == (char *)0x0) {
LAB_0015ba0c:
                                                      std::__cxx11::ostringstream::ostringstream
                                                                ((ostringstream *)&oss);
                                                      pcVar18 = (char *)0x4;
                                                      if (end < (char *)0x4) {
                                                        pcVar18 = end;
                                                      }
                                                      s._0_16_ = std::
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  ::substr((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,(size_type)pcVar18);
                                                  cpp_quote_abi_cxx11_
                                                            (&qs,(mjs *)&s,s._M_string_length);
                                                  poVar12 = std::operator<<((ostream *)&oss,
                                                                                                                                                        
                                                  "Unhandled character(s) in ");
                                                  poVar12 = std::operator<<(poVar12,
                                                  "get_punctuation");
                                                  poVar12 = std::operator<<(poVar12,": ");
                                                  s._M_dataplus._M_p = (pointer)&s.field_2;
                                                  std::__cxx11::string::
                                                  _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                                                            ((string *)&s,qs._M_dataplus._M_p,
                                                             qs._M_dataplus._M_p +
                                                             qs._M_string_length);
                                                  poVar12 = std::operator<<(poVar12,(string *)&s);
                                                  std::operator<<(poVar12,"\n");
                                                  std::__cxx11::string::~string((string *)&s);
                                                  prVar13 = (runtime_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::__cxx11::stringbuf::str();
                                                  std::runtime_error::runtime_error
                                                            (prVar13,(string *)&s);
                                                  __cxa_throw(prVar13,&std::runtime_error::typeinfo,
                                                              std::runtime_error::~runtime_error);
                                                  }
                                                  pcVar18 = (char *)0x1;
                                                  iVar8 = std::
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  ::compare((
                                                  basic_string_view<wchar_t,_std::char_traits<wchar_t>_>
                                                  *)&end,0,1,L";");
                                                  if (iVar8 != 0) goto LAB_0015ba0c;
                                                  type = semicolon;
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          type = rshiftshiftequal;
          pcVar18 = (char *)0x4;
        }
LAB_0015b721:
        local_210 = (anon_unknown_2 *)(pcVar18 + this->text_pos_);
        token::token((token *)&oss,type);
        goto LAB_0015a9e2;
      }
      if ((wVar1 != L'*') && (wVar1 != L'/')) {
        __assert_fail("text[pos] == \'/\' || text[pos] == \'*\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp"
                      ,0x8a,
                      "std::pair<token, size_t> mjs::(anonymous namespace)::skip_comment(const std::wstring_view &, size_t, version)"
                     );
      }
      paVar17 = paVar17 + 2;
      if (wVar1 == L'/') {
        for (; paVar17 < this_00; paVar17 = paVar17 + 1) {
          bVar5 = anon_unknown_2::is_line_terminator(local_218[(long)paVar17],vVar2);
          if (bVar5) break;
        }
        qs._M_dataplus._M_p = (pointer)((ulong)qs._M_dataplus._M_p._4_4_ << 0x20);
        goto LAB_0015b4df;
      }
      bVar5 = false;
      bVar16 = 0;
      while( true ) {
        if (this_00 <= paVar17) {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar13,"Unterminated multi-line comment");
          __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        wVar1 = local_218[(long)paVar17];
        if (!(bool)(~bVar5 & 1) && wVar1 == L'/') break;
        bVar5 = wVar1 == L'*';
        bVar7 = anon_unknown_2::is_line_terminator(wVar1,vVar2);
        if (bVar7) {
          bVar16 = 1;
        }
        paVar17 = paVar17 + 1;
      }
      token::token((token *)&qs,(uint)bVar16);
      token::token((token *)&oss,(token *)&qs);
LAB_0015b4f6:
      token::~token((token *)&qs);
    }
  }
LAB_0015a7f9:
  qs._M_string_length = (size_type)&this->current_token_;
  qs._M_dataplus._M_p = (pointer)&local_210;
  std::tuple<mjs::token&,unsigned_long&>::operator=
            ((tuple<mjs::token&,unsigned_long&> *)&qs,(pair<mjs::token,_unsigned_long> *)&oss);
LAB_0015a801:
  token::~token((token *)&oss);
  this->text_pos_ = (size_t)local_210;
  return;
}

Assistant:

std::pair<token, size_t> get_string_literal(const std::wstring_view text_, const size_t token_start, version ver) {
    bool escape = false;
    std::wstring s;
    const auto ch = text_[token_start];
    assert(ch == '"' || ch == '\'');
    size_t token_end = token_start + 1;
    for ( ;; ++token_end) {
        if (token_end >= text_.size()) {
            throw std::runtime_error("Unterminated string");
        }
        const auto qch = text_[token_end];
        if (escape) {
            escape = false;
            switch (qch) {
            case '\'': s.push_back('\''); break;
            case '\"': s.push_back('\"'); break;
            case '\\': s.push_back('\\'); break;
            case 'b': s.push_back('\b'); break;
            case 'f': s.push_back('\f'); break;
            case 'n': s.push_back('\n'); break;
            case 'r': s.push_back('\r'); break;
            case 't': s.push_back('\t'); break;
            case 'v':
                // '\v' only support in ES3 onwards
                if (ver == version::es1) {
                    goto invalid_escape_sequence;
                }
                s.push_back('\v');
                break;
                // HexEscapeSeqeunce
            case 'x': case 'X':
                ++token_end;
                if (token_end + 2 >= text_.size()) {
                    throw std::runtime_error("Invalid hex escape sequence");
                }
                s.push_back(static_cast<wchar_t>(get_hex_value2(&text_[token_end])));
                token_end += 1; // Incremented in loop
                break;
                // OctalEscapeSequence
            case '0': case '1': case '2': case '3':
            case '4': case '5': case '6': case '7':
                {
                    const auto [och, len] =  get_octal_escape_sequence(text_, token_end);
                    token_end += len-1; // Incremented in loop
                    s.push_back(static_cast<wchar_t>(och));
                    break;
                }
                break;
                // UnicodeEscapeSequence
            case 'u': case 'U':
                ++token_end;
                if (token_end + 4 >= text_.size()) {
                    throw std::runtime_error("Invalid unicode escape sequence");
                }
                s.push_back(static_cast<wchar_t>(get_hex_value4(&text_[token_end])));
                token_end += 3; // Incremented in loop
                break;
            default:
                if (is_line_terminator(qch, ver)) {
                    if (ver >= version::es5) {
                        // OK, line continuation
                        break;
                    }
                    throw std::runtime_error("Line continuations in string literals not supported until ES5");
                }
            invalid_escape_sequence:
                std::ostringstream oss;
                oss << "Unhandled escape sequence: \\" << (char)qch;
                throw std::runtime_error(oss.str());
            }
        } else if (qch == '\\') {
            escape = true;
        } else if (qch == ch) {
            ++token_end;
            break;
        } else if (is_line_terminator(qch, ver)) {
            throw std::runtime_error("Line terminator in string");
        } else {        
            if (ver == version::es3 && classify(qch) == unicode::classification::format) {
                throw std::runtime_error("Format control characters not allowed in string literals in ES3");
            }
            s.push_back(qch);
        }
    }

    return { token{token_type::string_literal, std::move(s)}, token_end };
}